

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::MatrixCompMult>::
MatrixFuncCaseFactory(MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::MatrixCompMult> *this)

{
  MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::MatrixCompMult> *this_local;
  
  FuncCaseFactory::FuncCaseFactory(&this->super_FuncCaseFactory);
  (this->super_FuncCaseFactory).super_CaseFactory._vptr_CaseFactory =
       (_func_int **)&PTR__MatrixFuncCaseFactory_016bec68;
  return;
}

Assistant:

MovePtr<TestNode>	createCase		(const CaseContext& ctx) const
	{
		TestCaseGroup*	const group = new TestCaseGroup(ctx.testContext, ctx.name.c_str(), ctx.name.c_str());

		this->addCase<2, 2>(ctx, group);
		this->addCase<3, 2>(ctx, group);
		this->addCase<4, 2>(ctx, group);
		this->addCase<2, 3>(ctx, group);
		this->addCase<3, 3>(ctx, group);
		this->addCase<4, 3>(ctx, group);
		this->addCase<2, 4>(ctx, group);
		this->addCase<3, 4>(ctx, group);
		this->addCase<4, 4>(ctx, group);

		return MovePtr<TestNode>(group);
	}